

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

size_t __thiscall QPDFWriter::calculateXrefStreamPadding(QPDFWriter *this,qpdf_offset_t xref_bytes)

{
  unsigned_long uVar1;
  long local_8;
  
  local_8 = ((xref_bytes + 0x3fff) / 0x4000) * 5 + 0x10;
  uVar1 = QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::convert(&local_8);
  return uVar1;
}

Assistant:

size_t
QPDFWriter::calculateXrefStreamPadding(qpdf_offset_t xref_bytes)
{
    // This routine is called right after a linearization first pass xref stream has been written
    // without compression.  Calculate the amount of padding that would be required in the worst
    // case, assuming the number of uncompressed bytes remains the same. The worst case for zlib is
    // that the output is larger than the input by 6 bytes plus 5 bytes per 16K, and then we'll add
    // 10 extra bytes for number length increases.

    return QIntC::to_size(16 + (5 * ((xref_bytes + 16383) / 16384)));
}